

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O0

int __thiscall ElfFile::findSegmentlessSection(ElfFile *this,string *name)

{
  bool bVar1;
  size_type sVar2;
  reference ppEVar3;
  string *b;
  int local_24;
  int i;
  string *name_local;
  ElfFile *this_local;
  
  local_24 = 0;
  while( true ) {
    sVar2 = std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::size(&this->sections);
    if ((int)sVar2 <= local_24) {
      return -1;
    }
    ppEVar3 = std::vector<ElfSection_*,_std::allocator<ElfSection_*>_>::operator[]
                        (&this->segmentlessSections,(long)local_24);
    b = ElfSection::getName_abi_cxx11_(*ppEVar3);
    bVar1 = stringEqualInsensitive(name,b);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int ElfFile::findSegmentlessSection(const std::string& name)
{
	for (int i = 0; i < (int)sections.size(); i++)
	{
		if (stringEqualInsensitive(name,segmentlessSections[i]->getName()))
			return i;
	}

	return -1;
}